

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_monitor.c
# Opt level: O0

void outputHandleGeometry
               (void *userData,wl_output *output,int32_t x,int32_t y,int32_t physicalWidth,
               int32_t physicalHeight,int32_t subpixel,char *make,char *model,int32_t transform)

{
  size_t sVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  char *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  _GLFWmonitor *monitor;
  
  *(undefined4 *)(in_RDI + 0x110) = in_EDX;
  *(undefined4 *)(in_RDI + 0x114) = in_ECX;
  *(undefined4 *)(in_RDI + 0x88) = in_R8D;
  *(undefined4 *)(in_RDI + 0x8c) = in_R9D;
  sVar1 = strlen(in_RDI);
  if (sVar1 == 0) {
    snprintf(in_RDI,0x80,"%s %s",CONCAT44(x,y),output);
  }
  return;
}

Assistant:

static void outputHandleGeometry(void* userData,
                                 struct wl_output* output,
                                 int32_t x,
                                 int32_t y,
                                 int32_t physicalWidth,
                                 int32_t physicalHeight,
                                 int32_t subpixel,
                                 const char* make,
                                 const char* model,
                                 int32_t transform)
{
    struct _GLFWmonitor* monitor = userData;

    monitor->wl.x = x;
    monitor->wl.y = y;
    monitor->widthMM = physicalWidth;
    monitor->heightMM = physicalHeight;

    if (strlen(monitor->name) == 0)
        snprintf(monitor->name, sizeof(monitor->name), "%s %s", make, model);
}